

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbor_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::cbor::basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_>::visit_key
          (basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *this,
          string_view_type *name,ser_context *context,error_code *ec)

{
  error_code *in_stack_00000030;
  ser_context *in_stack_00000038;
  semantic_tag in_stack_00000047;
  string_view_type *in_stack_00000048;
  basic_cbor_encoder<jsoncons::binary_stream_sink,_std::allocator<char>_> *in_stack_00000050;
  
  visit_string(in_stack_00000050,in_stack_00000048,in_stack_00000047,in_stack_00000038,
               in_stack_00000030);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_key(const string_view_type& name, const ser_context& context, std::error_code& ec) override
    {
        visit_string(name, semantic_tag::none, context, ec);
        JSONCONS_VISITOR_RETURN;
    }